

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaCheckFacetValues(xmlSchemaTypePtr typeDecl,xmlSchemaParserCtxtPtr pctxt)

{
  int iVar1;
  void *pvVar2;
  xmlSchemaValidityErrorFunc p_Var3;
  xmlSchemaValidityWarningFunc p_Var4;
  xmlSchemaValidCtxtPtr pxVar5;
  xmlStructuredErrorFunc p_Var6;
  int iVar7;
  xmlSchemaValidCtxtPtr pxVar8;
  xmlSchemaParserCtxtPtr pxVar9;
  char *in_R8;
  int in_R9D;
  xmlSchemaParserCtxtPtr pxVar10;
  xmlSchemaFacetPtr facet;
  int in_stack_ffffffffffffffb0;
  
  facet = typeDecl->facets;
  iVar7 = 0;
  if (facet != (xmlSchemaFacetPtr)0x0) {
    iVar1 = pctxt->nberrors;
    if (pctxt->vctxt == (xmlSchemaValidCtxtPtr)0x0) {
      pxVar8 = xmlSchemaNewValidCtxt((xmlSchemaPtr)0x0);
      pctxt->vctxt = pxVar8;
      if (pxVar8 == (xmlSchemaValidCtxtPtr)0x0) {
        xmlSchemaPErrFull(pctxt,(xmlNodePtr)0x0,0xbfd,XML_ERR_ERROR,in_R8,in_R9D,(xmlChar *)0x0,
                          (xmlChar *)0x0,(xmlChar *)0x0,in_stack_ffffffffffffffb0,
                          "Internal error: xmlSchemaCreateVCtxtOnPCtxt, failed to create a temp. validation context.\n"
                          ,0,0);
        return -1;
      }
      pvVar2 = pctxt->errCtxt;
      p_Var3 = pctxt->error;
      p_Var4 = pctxt->warning;
      pxVar8->error = p_Var3;
      pxVar8->warning = p_Var4;
      pxVar9 = pxVar8->pctxt;
      pxVar10 = pxVar9;
      if (pxVar9 == (xmlSchemaParserCtxtPtr)0x0) {
        pxVar8->serror = pctxt->serror;
        pxVar8->error = (xmlSchemaValidityErrorFunc)0x0;
        pxVar8->warning = (xmlSchemaValidityWarningFunc)0x0;
        pxVar8->errCtxt = pvVar2;
      }
      else {
        do {
          pxVar10->error = p_Var3;
          pxVar10->warning = p_Var4;
          pxVar10->errCtxt = pvVar2;
          pxVar5 = pxVar10->vctxt;
          if (pxVar5 == (xmlSchemaValidCtxtPtr)0x0) break;
          pxVar5->error = p_Var3;
          pxVar5->warning = p_Var4;
          pxVar5->errCtxt = pvVar2;
          pxVar10 = pxVar5->pctxt;
        } while (pxVar5->pctxt != (xmlSchemaParserCtxtPtr)0x0);
        pvVar2 = pctxt->errCtxt;
        p_Var6 = pctxt->serror;
        pxVar8->serror = p_Var6;
        pxVar8->error = (xmlSchemaValidityErrorFunc)0x0;
        pxVar8->warning = (xmlSchemaValidityWarningFunc)0x0;
        pxVar8->errCtxt = pvVar2;
        do {
          pxVar9->serror = p_Var6;
          pxVar9->errCtxt = pvVar2;
          pxVar8 = pxVar9->vctxt;
          if (pxVar8 == (xmlSchemaValidCtxtPtr)0x0) break;
          pxVar8->serror = p_Var6;
          pxVar8->error = (xmlSchemaValidityErrorFunc)0x0;
          pxVar8->warning = (xmlSchemaValidityWarningFunc)0x0;
          pxVar8->errCtxt = pvVar2;
          pxVar9 = pxVar8->pctxt;
        } while (pxVar9 != (xmlSchemaParserCtxtPtr)0x0);
      }
    }
    pxVar8 = pctxt->vctxt;
    pxVar8->schema = pctxt->schema;
    do {
      iVar7 = xmlSchemaCheckFacet(facet,typeDecl,pctxt,(xmlChar *)pxVar8);
      if (iVar7 == -1) {
        return -1;
      }
      facet = facet->next;
    } while (facet != (_xmlSchemaFacet *)0x0);
    pctxt->vctxt->schema = (xmlSchemaPtr)0x0;
    iVar7 = 0;
    if (iVar1 != pctxt->nberrors) {
      iVar7 = pctxt->err;
    }
  }
  return iVar7;
}

Assistant:

static int
xmlSchemaCheckFacetValues(xmlSchemaTypePtr typeDecl,
			  xmlSchemaParserCtxtPtr pctxt)
{
    int res, olderrs = pctxt->nberrors;
    const xmlChar *name = typeDecl->name;
    /*
    * NOTE: It is intended to use the facets list, instead
    * of facetSet.
    */
    if (typeDecl->facets != NULL) {
	xmlSchemaFacetPtr facet = typeDecl->facets;

	/*
	* Temporarily assign the "schema" to the validation context
	* of the parser context. This is needed for NOTATION validation.
	*/
	if (pctxt->vctxt == NULL) {
	    if (xmlSchemaCreateVCtxtOnPCtxt(pctxt) == -1)
		return(-1);
	}
	pctxt->vctxt->schema = pctxt->schema;
	while (facet != NULL) {
	    res = xmlSchemaCheckFacet(facet, typeDecl, pctxt, name);
	    HFAILURE
	    facet = facet->next;
	}
	pctxt->vctxt->schema = NULL;
    }
    if (olderrs != pctxt->nberrors)
	return(pctxt->err);
    return(0);
exit_failure:
    return(-1);
}